

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

PipelineClassifier *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::PipelineClassifier>
          (Arena *arena)

{
  PipelineClassifier *this;
  
  if (arena == (Arena *)0x0) {
    this = (PipelineClassifier *)operator_new(0x20);
    CoreML::Specification::PipelineClassifier::PipelineClassifier(this,(Arena *)0x0,false);
  }
  else {
    this = (PipelineClassifier *)
           AllocateAlignedWithHook
                     (arena,0x20,(type_info *)&CoreML::Specification::PipelineClassifier::typeinfo);
    CoreML::Specification::PipelineClassifier::PipelineClassifier(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }